

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdi::ControllerWidget::mouseReleaseEvent(ControllerWidget *this,QMouseEvent *event)

{
  SubControl SVar1;
  long in_FS_OFFSET;
  QPointF local_28;
  QPoint local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(event + 0x40) == 1) {
    local_28 = QSinglePointEvent::position((QSinglePointEvent *)event);
    local_18 = QPointF::toPoint(&local_28);
    SVar1 = getSubControl(this,&local_18);
    if (SVar1 == this->activeControl) {
      if (SVar1 == SC_ComboBoxFrame) {
        _q_minimize(this);
      }
      else if (SVar1 == SC_ComboBoxEditField) {
        _q_restore(this);
      }
      else if (SVar1 == SC_ComboBoxArrow) {
        _q_close(this);
      }
    }
    this->activeControl = SC_None;
    QWidget::update(&this->super_QWidget);
  }
  else {
    event[0xc] = (QMouseEvent)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ControllerWidget::mouseReleaseEvent(QMouseEvent *event)
{
    if (event->button() != Qt::LeftButton) {
        event->ignore();
        return;
    }

    QStyle::SubControl under_mouse = getSubControl(event->position().toPoint());
    if (under_mouse == activeControl) {
        switch (activeControl) {
        case QStyle::SC_MdiCloseButton:
            emit _q_close();
            break;
        case QStyle::SC_MdiNormalButton:
            emit _q_restore();
            break;
        case QStyle::SC_MdiMinButton:
            emit _q_minimize();
            break;
        default:
            break;
        }
    }

    activeControl = QStyle::SC_None;
    update();
}